

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossiblePattern(TokenKind kind)

{
  short in_DI;
  undefined1 local_1;
  
  if ((in_DI == 0xc) || (in_DI == 0x19)) {
    local_1 = true;
  }
  else if (in_DI == 0x5b) {
    local_1 = false;
  }
  else {
    local_1 = isPossibleExpression(kind);
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossiblePattern(TokenKind kind) {
    switch (kind) {
        case TokenKind::Dot:
        case TokenKind::ApostropheOpenBrace:
            return true;
        case TokenKind::TripleAnd:
            return false;
        default:
            return isPossibleExpression(kind);
    }
}